

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1afbd7e::HBDMinMaxTest_MinValue_Test::TestBody(HBDMinMaxTest_MinValue_Test *this)

{
  undefined8 *puVar1;
  void *pvVar2;
  void *pvVar3;
  size_t i;
  long lVar4;
  pointer *__ptr;
  SEARCH_METHODS *pSVar5;
  undefined2 in_FPUControlWord;
  uint16_t in_FPUTagWord;
  undefined8 in_FPUInstructionPointer;
  Message local_88;
  int local_80;
  int min;
  RegisterStateCheckMMX reg_check_mmx;
  AssertHelper local_58;
  uint8_t *local_50;
  uint8_t *local_48;
  HBDMinMaxTest_MinValue_Test *local_40;
  int max;
  
  local_40 = this;
  pvVar2 = aom_malloc(0x80);
  local_48 = (uint8_t *)((ulong)pvVar2 >> 1);
  pvVar3 = aom_malloc(0x80);
  local_50 = (uint8_t *)((ulong)pvVar3 >> 1);
  pvVar3 = (void *)((ulong)pvVar3 & 0xfffffffffffffffe);
  for (local_80 = 0; reg_check_mmx.pre_fpu_env_[0]._0_1_ = (char)in_FPUControlWord, local_80 < 0x40;
      local_80 = local_80 + 1) {
    for (lVar4 = 0; lVar4 != 0x40; lVar4 = lVar4 + 1) {
      *(undefined2 *)((long)((ulong)pvVar2 & 0xfffffffffffffffe) + lVar4 * 2) = 0;
    }
    for (lVar4 = 0; lVar4 != 0x40; lVar4 = lVar4 + 1) {
      *(undefined2 *)((long)pvVar3 + lVar4 * 2) = 0xffff;
    }
    *(short *)((long)pvVar3 + (long)local_80 * 2) = (short)local_80;
    reg_check_mmx.pre_fpu_env_._12_4_ = SUB84(in_FPUInstructionPointer,0);
    reg_check_mmx.pre_fpu_env_[8] = (uint16_t)((ulong)in_FPUInstructionPointer >> 0x20);
    reg_check_mmx.pre_fpu_env_[4] = in_FPUTagWord;
    (*(local_40->super_HBDMinMaxTest).mm_func_)(local_48,8,local_50,8,&min,&max);
    libaom_test::RegisterStateCheckMMX::~RegisterStateCheckMMX(&reg_check_mmx);
    local_88.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ = 0xffff;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&reg_check_mmx,"65535","max",(int *)&local_88,&max);
    if ((char)reg_check_mmx.pre_fpu_env_[0] == '\0') {
      testing::Message::Message(&local_88);
      puVar1 = (undefined8 *)
               CONCAT44(reg_check_mmx.pre_fpu_env_._12_4_,
                        CONCAT22(reg_check_mmx.pre_fpu_env_[5],reg_check_mmx.pre_fpu_env_[4]));
      pSVar5 = "";
      if (puVar1 != (undefined8 *)0x0) {
        pSVar5 = (SEARCH_METHODS *)*puVar1;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_58,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/minmax_test.cc"
                 ,0x9b,(char *)pSVar5);
      testing::internal::AssertHelper::operator=(&local_58,&local_88);
      testing::internal::AssertHelper::~AssertHelper(&local_58);
      if ((long *)CONCAT44(local_88.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._4_4_,
                           local_88.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_88.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._4_4_,
                                       local_88.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._0_4_) + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(reg_check_mmx.pre_fpu_env_ + 4));
    testing::internal::CmpHelperEQ<int,int>((internal *)&reg_check_mmx,"i","min",&local_80,&min);
    if ((char)reg_check_mmx.pre_fpu_env_[0] == '\0') {
      testing::Message::Message(&local_88);
      puVar1 = (undefined8 *)
               CONCAT44(reg_check_mmx.pre_fpu_env_._12_4_,
                        CONCAT22(reg_check_mmx.pre_fpu_env_[5],reg_check_mmx.pre_fpu_env_[4]));
      pSVar5 = "";
      if (puVar1 != (undefined8 *)0x0) {
        pSVar5 = (SEARCH_METHODS *)*puVar1;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_58,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/minmax_test.cc"
                 ,0x9c,(char *)pSVar5);
      testing::internal::AssertHelper::operator=(&local_58,&local_88);
      testing::internal::AssertHelper::~AssertHelper(&local_58);
      if ((long *)CONCAT44(local_88.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._4_4_,
                           local_88.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_88.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._4_4_,
                                       local_88.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._0_4_) + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(reg_check_mmx.pre_fpu_env_ + 4));
  }
  aom_free((void *)((ulong)pvVar2 & 0xfffffffffffffffe));
  aom_free(pvVar3);
  return;
}

Assistant:

TEST_P(HBDMinMaxTest, MinValue) {
  uint8_t *a = CONVERT_TO_BYTEPTR(
      reinterpret_cast<uint16_t *>(aom_malloc(64 * sizeof(uint16_t))));
  uint8_t *b = CONVERT_TO_BYTEPTR(
      reinterpret_cast<uint16_t *>(aom_malloc(64 * sizeof(uint16_t))));
  for (int i = 0; i < 64; i++) {
    aom_memset16(CONVERT_TO_SHORTPTR(a), 0, 64);
    aom_memset16(CONVERT_TO_SHORTPTR(b), 65535, 64);
    CONVERT_TO_SHORTPTR(b)[i] = i;  // Set a minimum difference of i.

    int min, max;
    API_REGISTER_STATE_CHECK(mm_func_(a, 8, b, 8, &min, &max));
    EXPECT_EQ(65535, max);
    EXPECT_EQ(i, min);
  }
  aom_free(CONVERT_TO_SHORTPTR(a));
  aom_free(CONVERT_TO_SHORTPTR(b));
}